

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O0

bool __thiscall gui::DialogBox::handleKeyPressed(DialogBox *this,KeyEvent *key)

{
  bool bVar1;
  KeyEvent *in_RSI;
  long in_RDI;
  DialogBox *in_stack_00000030;
  shared_ptr<gui::Button> *cancelButton;
  shared_ptr<gui::Button> *submitButton;
  bool eventConsumed;
  DialogBox *in_stack_ffffffffffffff68;
  shared_ptr<gui::Button> *in_stack_ffffffffffffff70;
  Vector2<float> in_stack_ffffffffffffff90;
  element_type *in_stack_ffffffffffffff98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffa0;
  Vector2<float> local_40;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> *local_28;
  byte local_19;
  KeyEvent *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  local_19 = Widget::handleKeyPressed((Widget *)(in_RDI + 0x20),in_RSI);
  if (local_18->code == Enter) {
    getSubmitButton(in_stack_ffffffffffffff68);
    local_28 = &local_38;
    bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x195793);
      std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::get(local_28);
      sf::Vector2<float>::Vector2(&local_40,0.0,0.0);
      Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
                ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)
                 in_stack_ffffffffffffffa0._M_pi,&in_stack_ffffffffffffff98->super_Widget,
                 (Vector2<float> *)in_stack_ffffffffffffff90);
    }
    std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1957fe);
  }
  else {
    if (local_18->code == Escape) {
      getCancelButton(in_stack_ffffffffffffff68);
      bVar1 = std::operator!=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar1) {
        std::__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<gui::Button,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x19584b);
        std::__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2>::get
                  ((__shared_ptr<gui::Button,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff98
                  );
        sf::Vector2<float>::Vector2((Vector2<float> *)&stack0xffffffffffffff90,0.0,0.0);
        Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::emit
                  ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)
                   in_stack_ffffffffffffffa0._M_pi,&in_stack_ffffffffffffff98->super_Widget,
                   (Vector2<float> *)in_stack_ffffffffffffff90);
      }
      local_1 = local_19 & 1;
      std::shared_ptr<gui::Button>::~shared_ptr((shared_ptr<gui::Button> *)0x1958be);
      goto LAB_001958f4;
    }
    local_1 = local_19;
    if (local_18->code != Tab) goto LAB_001958f4;
    focusNextTextBox(in_stack_00000030);
  }
  local_1 = 1;
LAB_001958f4:
  return (bool)(local_1 & 1);
}

Assistant:

bool DialogBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (key.code == sf::Keyboard::Enter) {
        const auto& submitButton = getSubmitButton();
        if (submitButton != nullptr) {
            submitButton->onClick.emit(submitButton.get(), sf::Vector2f(0.0f, 0.0f));
        }
    } else if (key.code == sf::Keyboard::Escape) {
        const auto& cancelButton = getCancelButton();
        if (cancelButton != nullptr) {
            cancelButton->onClick.emit(cancelButton.get(), sf::Vector2f(0.0f, 0.0f));
        }
        return eventConsumed;    // Do not consume escape event.
    } else if (key.code == sf::Keyboard::Tab) {
        focusNextTextBox();
    } else {
        return eventConsumed;
    }
    return true;
}